

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::sessionFixtureLogOn_TimeoutWaitingForLogOnResponseHelper::RunImpl
          (sessionFixtureLogOn_TimeoutWaitingForLogOnResponseHelper *this)

{
  int64_t *this_00;
  TestResults *this_01;
  bool bVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  UtcTimeStamp *val;
  UtcTimeStamp *val_00;
  TestDetails local_368;
  Logon local_338;
  Message local_1e0 [8];
  Message sentLogon;
  undefined1 local_88 [8];
  UtcTimeStamp time;
  UtcTimeOnly local_58;
  UtcTimeStamp local_40;
  UtcTimeStamp local_28;
  sessionFixtureLogOn_TimeoutWaitingForLogOnResponseHelper *local_10;
  sessionFixtureLogOn_TimeoutWaitingForLogOnResponseHelper *this_local;
  
  local_10 = this;
  FIX::UtcTimeStamp::UtcTimeStamp(&local_28,8,8,8,0xd,5,0x7df);
  val = &(this->super_sessionFixture).super_TestCallback.startTimeStamp;
  FIX::UtcTimeStamp::operator=(val,&local_28);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_28);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_40,0x10,0x10,0x10,0xd,5,0x898);
  val_00 = &(this->super_sessionFixture).super_TestCallback.endTimeStamp;
  FIX::UtcTimeStamp::operator=(val_00,&local_40);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_40);
  FIX::UtcTimeOnly::UtcTimeOnly(&local_58,&val->super_DateTime);
  FIX::UtcTimeOnly::operator=(&(this->super_sessionFixture).super_TestCallback.startTime,&local_58);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_58);
  this_00 = &time.super_DateTime.m_time;
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)this_00,&val_00->super_DateTime);
  FIX::UtcTimeOnly::operator=
            (&(this->super_sessionFixture).super_TestCallback.endTime,(UtcTimeOnly *)this_00);
  FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)this_00);
  (*(this->super_sessionFixture).super_TestCallback.super_Responder._vptr_Responder[8])();
  FIX::Session::setLogonTimeout((this->super_sessionFixture).object,0);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)local_88);
  createLogon(&local_338,"TW","ISLD",1);
  FIX::Message::Message(local_1e0,(Message *)&local_338);
  FIX42::Logon::~Logon(&local_338);
  FIX::Session::send((Message *)(this->super_sessionFixture).object);
  FIX::Session::next();
  FIX::Session::next();
  bVar1 = FIX::Session::sentLogon((this->super_sessionFixture).object);
  bVar1 = UnitTest::Check<bool>((bool)(~bVar1 & 1));
  if (!bVar1) {
    ppTVar2 = UnitTest::CurrentTest::Results();
    this_01 = *ppTVar2;
    ppTVar3 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_368,*ppTVar3,0x741);
    UnitTest::TestResults::OnTestFailure(this_01,&local_368,"!object->sentLogon()");
  }
  FIX::Message::~Message(local_1e0);
  FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)local_88);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, LogOn_TimeoutWaitingForLogOnResponse) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );
  createSession(1, 0, 31);
  object->setLogonTimeout(0);

  UtcTimeStamp time;

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->next();

  CHECK(!object->sentLogon());
}